

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::LoadAllConstants(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  RegSlot value;
  Symbol *pSVar4;
  Type pSVar5;
  code *pcVar6;
  bool bVar7;
  RegSlot RVar8;
  BOOL BVar9;
  uint uVar10;
  FunctionBody *pFVar11;
  undefined4 *puVar12;
  Recycler *alloc;
  PropertyIdArray *propIds;
  Symbol *pSVar13;
  Scope *pSVar14;
  ulong uVar15;
  Type TVar16;
  int iVar17;
  uint uVar18;
  undefined1 local_68 [8];
  TrackAllocData data;
  bool local_34;
  
  pFVar11 = FuncInfo::GetParsedFunctionBody(funcInfo);
  Js::FunctionBody::CreateConstantTable(pFVar11);
  if (funcInfo->nullConstantRegister != 0xffffffff) {
    RVar8 = Js::FunctionBody::MapRegSlot(pFVar11,funcInfo->nullConstantRegister);
    Js::FunctionBody::RecordNullObject(pFVar11,RVar8);
  }
  if (funcInfo->undefinedConstantRegister != 0xffffffff) {
    RVar8 = Js::FunctionBody::MapRegSlot(pFVar11,funcInfo->undefinedConstantRegister);
    Js::FunctionBody::RecordUndefinedObject(pFVar11,RVar8);
  }
  if (funcInfo->trueConstantRegister != 0xffffffff) {
    RVar8 = Js::FunctionBody::MapRegSlot(pFVar11,funcInfo->trueConstantRegister);
    Js::FunctionBody::RecordTrueObject(pFVar11,RVar8);
  }
  if (funcInfo->falseConstantRegister != 0xffffffff) {
    RVar8 = Js::FunctionBody::MapRegSlot(pFVar11,funcInfo->falseConstantRegister);
    Js::FunctionBody::RecordFalseObject(pFVar11,RVar8);
  }
  if (funcInfo->frameObjRegister == 0xffffffff) {
    RVar8 = funcInfo->frameSlotsRegister;
    if ((RVar8 != 0xffffffff) &&
       (funcInfo->paramScope->scopeSlotCount == 0 && funcInfo->bodyScope->scopeSlotCount == 0)) {
      if (funcInfo->frameDisplayRegister == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x79c,"(funcInfo->frameDisplayRegister != Js::Constants::NoRegister)",
                           "Why do we need scope slots?");
        if (!bVar7) goto LAB_0075de4a;
        *puVar12 = 0;
        RVar8 = funcInfo->frameSlotsRegister;
      }
      Js::ByteCodeWriter::Reg1(&this->m_writer,LdC_A_Null,RVar8);
    }
  }
  else {
    Js::ByteCodeWriter::RecordObjectRegister(&this->m_writer,funcInfo->frameObjRegister);
    if ((funcInfo->field_0xb5 & 4) == 0) {
      EmitScopeObjectInit(this,funcInfo);
    }
    TVar16 = 0;
    pSVar13 = funcInfo->bodyScope->m_symList;
    while (pSVar13 != (Symbol *)0x0) {
      pSVar4 = pSVar13->next;
      bVar7 = Symbol::NeedsSlotAlloc(pSVar13,this,funcInfo);
      TVar16 = TVar16 + bVar7;
      pSVar13 = pSVar4;
    }
    if (funcInfo->paramScope != (Scope *)0x0) {
      pSVar13 = funcInfo->paramScope->m_symList;
      while (pSVar13 != (Symbol *)0x0) {
        pSVar4 = pSVar13->next;
        bVar7 = Symbol::NeedsSlotAlloc(pSVar13,this,funcInfo);
        TVar16 = TVar16 + bVar7;
        pSVar13 = pSVar4;
      }
    }
    bVar1 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    if (((((bVar1 & 0x10) != 0) && (pFVar11->byteCodeCache == (Type)0x0)) && ((bVar1 & 0x40) == 0))
       && ((pFVar11->super_ParseableFunctionInfo).scopeObjectSize != TVar16)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x792,
                         "(!byteCodeFunction->IsReparsed() || byteCodeFunction->HasGeneratedFromByteCodeCache() || byteCodeFunction->scopeObjectSize == count || byteCodeFunction->WasEverAsmJsMode())"
                         ,"The activation object size is different between debug and non-debug mode"
                        );
      if (!bVar7) goto LAB_0075de4a;
      *puVar12 = 0;
    }
    (pFVar11->super_ParseableFunctionInfo).scopeObjectSize = TVar16;
  }
  pSVar14 = funcInfo->funcExprScope;
  if ((pSVar14 != (Scope *)0x0) && ((pSVar14->field_0x44 & 2) != 0)) {
    Js::FunctionBody::MapAndSetFuncExprScopeRegister(pFVar11,pSVar14->location);
    pFVar11->m_envDepth = 0xffff;
  }
  if ((funcInfo->field_0xb5 & 0x40) == 0) {
LAB_0075d91e:
    local_34 = false;
  }
  else {
    RVar8 = FuncInfo::GetEnvRegister(funcInfo);
    Js::FunctionBody::MapAndSetEnvRegister(pFVar11,RVar8);
    if ((funcInfo->field_0xb4 & 0x20) == 0) {
      bVar7 = FuncInfo::IsGlobalFunction(funcInfo);
      if ((bVar7) && ((this->flags & 0x400) == 0)) {
        RVar8 = FuncInfo::GetEnvRegister(funcInfo);
        if (RVar8 < funcInfo->varRegsCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x7b9,"(funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                             "funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
          if (!bVar7) goto LAB_0075de4a;
          *puVar12 = 0;
        }
        uVar2 = *(ushort *)&(funcInfo->byteCodeFunction->super_FunctionProxy).field_0x45;
        RVar8 = FuncInfo::GetEnvRegister(funcInfo);
        RVar8 = Js::FunctionBody::MapRegSlot(pFVar11,RVar8);
        if ((uVar2 >> 8 & 1) == 0) {
          Js::FunctionBody::RecordNullDisplayConstant(pFVar11,RVar8);
        }
        else {
          Js::FunctionBody::RecordStrictNullDisplayConstant(pFVar11,RVar8);
        }
      }
      else {
        RVar8 = FuncInfo::GetEnvRegister(funcInfo);
        if (funcInfo->varRegsCount <= RVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x7c7,"(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                             "!funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
          if (!bVar7) goto LAB_0075de4a;
          *puVar12 = 0;
        }
        InvalidateCachedOuterScopes(this,funcInfo);
      }
      goto LAB_0075d91e;
    }
    if (funcInfo->thisSymbol != (Symbol *)0x0) {
      Js::FunctionBody::MapAndSetThisRegisterForEventHandler(pFVar11,funcInfo->thisSymbol->location)
      ;
    }
    RVar8 = FuncInfo::GetEnvRegister(funcInfo);
    if (funcInfo->varRegsCount <= RVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7b3,"(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()))",
                         "!funcInfo->RegIsConst(funcInfo->GetEnvRegister())");
      if (!bVar7) goto LAB_0075de4a;
      *puVar12 = 0;
    }
    InvalidateCachedOuterScopes(this,funcInfo);
    local_34 = true;
  }
  if (funcInfo->frameDisplayRegister != 0xffffffff) {
    Js::ByteCodeWriter::RecordFrameDisplayRegister(&this->m_writer,funcInfo->frameDisplayRegister);
  }
  RecordAllIntConstants(this,funcInfo);
  RecordAllStrConstants(this,funcInfo);
  RecordAllBigIntConstants(this,funcInfo);
  RecordAllStringTemplateCallsiteConstants(this,funcInfo);
  for (uVar15 = 0; uVar15 < (funcInfo->doubleConstantToRegister).bucketCount; uVar15 = uVar15 + 1) {
    iVar17 = (funcInfo->doubleConstantToRegister).buckets[uVar15];
    if (iVar17 != -1) {
      while (iVar17 != -1) {
        pSVar5 = (funcInfo->doubleConstantToRegister).entries;
        iVar3 = pSVar5[iVar17].
                super_DefaultHashedEntry<double,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<double,_unsigned_int>.
                super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<double,_unsigned_int>_>
                .super_KeyValueEntryDataLayout2<double,_unsigned_int>.next;
        data._32_8_ = pSVar5[iVar17].
                      super_DefaultHashedEntry<double,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .super_KeyValueEntry<double,_unsigned_int>.
                      super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<double,_unsigned_int>_>
                      .super_KeyValueEntryDataLayout2<double,_unsigned_int>.key;
        RVar8 = Js::FunctionBody::MapRegSlot
                          (pFVar11,pSVar5[iVar17].
                                   super_DefaultHashedEntry<double,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                   .super_KeyValueEntry<double,_unsigned_int>.
                                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<double,_unsigned_int>_>
                                   .super_KeyValueEntryDataLayout2<double,_unsigned_int>.value);
        Js::FunctionBody::RecordFloatConstant(pFVar11,RVar8,(double)data._32_8_);
        iVar17 = iVar3;
      }
    }
  }
  uVar18 = *(uint *)&funcInfo->field_0xb4;
  if ((uVar18 & 8) == 0) {
    bVar7 = FuncInfo::IsGlobalFunction(funcInfo);
    if (((!bVar7) && (bVar7 = IsInNonDebugMode(this), !bVar7)) &&
       (uVar18 = (uint)funcInfo->inArgsCount -
                 (uint)(funcInfo->root->pnodeRest == (ParseNodePtr)0x0), uVar18 != 0)) {
      if (0x3fffffff < uVar18) {
        Math::DefaultOverflowPolicy();
      }
      data.typeinfo = (type_info *)(ulong)(uVar18 * 4);
      local_68 = (undefined1  [8])&Js::PropertyIdArray::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_350e33c;
      data.filename._0_4_ = 0x7f1;
      alloc = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_68);
      propIds = (PropertyIdArray *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
      propIds->count = uVar18;
      propIds->extraSlots = '\0';
      propIds->hadDuplicates = false;
      propIds->has__proto__ = false;
      propIds->hasNonSimpleParams = false;
      GetFormalArgsArray(this,funcInfo,propIds);
      Js::FunctionBody::SetPropertyIdsOfFormals(pFVar11,propIds);
    }
  }
  else {
    if (funcInfo->argumentsSymbol == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7e3,"(sym)","sym");
      if (!bVar7) goto LAB_0075de4a;
      *puVar12 = 0;
      uVar18 = *(uint *)&funcInfo->field_0xb4;
    }
    if ((uVar18 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x7e4,"(funcInfo->GetHasHeapArguments())",
                         "funcInfo->GetHasHeapArguments()");
      if (!bVar7) goto LAB_0075de4a;
      *puVar12 = 0;
      uVar18 = *(uint *)&funcInfo->field_0xb4;
    }
    if ((uVar18 & 0x402) != 0x400) {
      LoadHeapArguments(this,funcInfo);
    }
  }
  BVar9 = FuncInfo::IsClassConstructor(funcInfo);
  if (BVar9 != 0) {
    Js::ByteCodeWriter::Empty(&this->m_writer,ChkNewCallFlag);
  }
  if (funcInfo->newTargetSymbol != (Symbol *)0x0) {
    LoadNewTargetObject(this,funcInfo);
  }
  if (funcInfo->thisSymbol == (Symbol *)0x0) {
    bVar7 = ShouldLoadConstThis(this,funcInfo);
    if (bVar7) {
      EmitThis(this,funcInfo,funcInfo->thisConstantRegister,funcInfo->nullConstantRegister);
    }
  }
  else {
    LoadThisObject(this,funcInfo,local_34);
  }
  if (funcInfo->superSymbol != (Symbol *)0x0) {
    LoadSuperObject(this,funcInfo);
  }
  if (funcInfo->superConstructorSymbol != (Symbol *)0x0) {
    LoadSuperConstructorObject(this,funcInfo);
  }
  if (funcInfo->importMetaSymbol != (Symbol *)0x0) {
    LoadImportMetaObject(this,funcInfo);
  }
  pSVar13 = ParseNodeFnc::GetFuncSymbol(funcInfo->root);
  bVar7 = FuncInfo::IsGlobalFunction(funcInfo);
  if (((pSVar13 != (Symbol *)0x0 && !bVar7) && ((pSVar13->field_0x42 & 0x20) != 0)) &&
     (((funcInfo->field_0xb5 & 2) != 0 ||
      ((funcInfo->funcExprScope != (Scope *)0x0 && ((funcInfo->funcExprScope->field_0x44 & 2) != 0))
      )))) {
    this_00 = &this->m_writer;
    Js::ByteCodeWriter::Reg1(this_00,LdFuncExpr,pSVar13->location);
    bVar7 = Symbol::IsInSlot(pSVar13,this,funcInfo,false);
    if (!bVar7) {
      bVar7 = ShouldTrackDebuggerMetadata(this);
      if (!bVar7) {
        return;
      }
      pFVar11 = Js::FunctionProxy::GetFunctionBody(&funcInfo->byteCodeFunction->super_FunctionProxy)
      ;
      Js::FunctionBody::InsertSymbolToRegSlotList
                (pFVar11,&pSVar13->name,pSVar13->location,funcInfo->varRegsCount);
      return;
    }
    pSVar14 = funcInfo->funcExprScope;
    if (pSVar14 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x839,"(funcInfo->funcExprScope)","funcInfo->funcExprScope");
      if (!bVar7) goto LAB_0075de4a;
      *puVar12 = 0;
      pSVar14 = funcInfo->funcExprScope;
    }
    if ((pSVar14->field_0x44 & 2) == 0) {
      uVar2 = *(ushort *)&funcInfo->paramScope->field_0x44;
      if (((uVar2 & 2) == 0) &&
         (((uVar2 & 0x14) != 4 || ((funcInfo->bodyScope->field_0x44 & 2) == 0)))) {
        iVar17 = pSVar13->scopeSlot;
        if (iVar17 == -1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x848,"(sym->HasScopeSlot())","sym->HasScopeSlot()");
          if (!bVar7) {
LAB_0075de4a:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar12 = 0;
          iVar17 = pSVar13->scopeSlot;
        }
        Js::ByteCodeWriter::SlotI1(this_00,StLocalSlot,pSVar13->location,iVar17 + 2);
      }
      else {
        RVar8 = pSVar13->location;
        uVar10 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,pSVar13->position);
        Js::ByteCodeWriter::ElementU(this_00,StLocalFuncExpr,RVar8,uVar10);
      }
    }
    else {
      RVar8 = pSVar14->location;
      value = pSVar13->location;
      uVar10 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,pSVar13->position);
      Js::ByteCodeWriter::Property(this_00,StFuncExpr,value,RVar8,uVar10,false);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::LoadAllConstants(FuncInfo *funcInfo)
{
    Symbol *sym;

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    byteCodeFunction->CreateConstantTable();

    if (funcInfo->nullConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordNullObject(byteCodeFunction->MapRegSlot(funcInfo->nullConstantRegister));
    }

    if (funcInfo->undefinedConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordUndefinedObject(byteCodeFunction->MapRegSlot(funcInfo->undefinedConstantRegister));
    }

    if (funcInfo->trueConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordTrueObject(byteCodeFunction->MapRegSlot(funcInfo->trueConstantRegister));
    }

    if (funcInfo->falseConstantRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->RecordFalseObject(byteCodeFunction->MapRegSlot(funcInfo->falseConstantRegister));
    }

    if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        m_writer.RecordObjectRegister(funcInfo->frameObjRegister);
        if (!funcInfo->GetApplyEnclosesArgs())
        {
            this->EmitScopeObjectInit(funcInfo);
        }

#if DBG
        uint count = 0;
        funcInfo->GetBodyScope()->ForEachSymbol([&](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                count++;
            }
        });

        if (funcInfo->GetParamScope() != nullptr)
        {
            funcInfo->GetParamScope()->ForEachSymbol([&](Symbol *const sym)
            {
                if (sym->NeedsSlotAlloc(this, funcInfo))
                {
                    // All properties should get correct propertyId here.
                    count++;
                }
            });
        }

        // A reparse should result in the same size of the activation object.
        // Exclude functions which were created from the ByteCodeCache.
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->HasGeneratedFromByteCodeCache() ||
            byteCodeFunction->scopeObjectSize == count || byteCodeFunction->WasEverAsmJsMode(),
            "The activation object size is different between debug and non-debug mode");
        byteCodeFunction->scopeObjectSize = count;
#endif
    }
    else if (funcInfo->frameSlotsRegister != Js::Constants::NoRegister)
    {
        int scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
        int paramSlotCount = funcInfo->paramScope->GetScopeSlotCount();
        if (scopeSlotCount == 0 && paramSlotCount == 0)
        {
            AssertMsg(funcInfo->frameDisplayRegister != Js::Constants::NoRegister, "Why do we need scope slots?");
            m_writer.Reg1(Js::OpCode::LdC_A_Null, funcInfo->frameSlotsRegister);
        }
    }

    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
    {
        byteCodeFunction->MapAndSetFuncExprScopeRegister(funcInfo->funcExprScope->GetLocation());
        byteCodeFunction->SetEnvDepth((uint16)-1);
    }

    bool thisLoadedFromParams = false;

    if (funcInfo->NeedEnvRegister())
    {
        byteCodeFunction->MapAndSetEnvRegister(funcInfo->GetEnvRegister());
        if (funcInfo->GetIsTopLevelEventHandler())
        {
            if (funcInfo->GetThisSymbol())
            {
                byteCodeFunction->MapAndSetThisRegisterForEventHandler(funcInfo->GetThisSymbol()->GetLocation());
            }
            // The environment is the namespace hierarchy starting with "this".
            Assert(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()));
            thisLoadedFromParams = true;
            this->InvalidateCachedOuterScopes(funcInfo);
        }
        else if (funcInfo->IsGlobalFunction() && !(this->flags & fscrEval))
        {
            Assert(funcInfo->RegIsConst(funcInfo->GetEnvRegister()));

            if (funcInfo->GetIsStrictMode())
            {
                byteCodeFunction->RecordStrictNullDisplayConstant(byteCodeFunction->MapRegSlot(funcInfo->GetEnvRegister()));
            }
            else
            {
                byteCodeFunction->RecordNullDisplayConstant(byteCodeFunction->MapRegSlot(funcInfo->GetEnvRegister()));
            }
        }
        else
        {
            // environment may be required to load "this"
            Assert(!funcInfo->RegIsConst(funcInfo->GetEnvRegister()));
            this->InvalidateCachedOuterScopes(funcInfo);
        }
    }

    if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
    {
        m_writer.RecordFrameDisplayRegister(funcInfo->frameDisplayRegister);
    }

    this->RecordAllIntConstants(funcInfo);
    this->RecordAllStrConstants(funcInfo);
    this->RecordAllBigIntConstants(funcInfo);
    this->RecordAllStringTemplateCallsiteConstants(funcInfo);

    funcInfo->doubleConstantToRegister.Map([byteCodeFunction](double d, Js::RegSlot location)
    {
        byteCodeFunction->RecordFloatConstant(byteCodeFunction->MapRegSlot(location), d);
    });

    // WARNING !!!
    // DO NOT emit any bytecode before loading the heap arguments. This is because those opcodes may bail 
    // out (unlikely, since opcodes emitted in this function should not correspond to user code, but possible)
    // and the Jit assumes that there cannot be any bailouts before LdHeapArguments (or its equivalent)

    if (funcInfo->GetHasArguments())
    {
        sym = funcInfo->GetArgumentsSymbol();
        Assert(sym);
        Assert(funcInfo->GetHasHeapArguments());

        if (funcInfo->GetCallsEval() || (!funcInfo->GetApplyEnclosesArgs()))
        {
            this->LoadHeapArguments(funcInfo);
        }

    }
    else if (!funcInfo->IsGlobalFunction() && !IsInNonDebugMode())
    {
        uint count = funcInfo->inArgsCount + (funcInfo->root->pnodeRest != nullptr ? 1 : 0) - 1;
        if (count != 0)
        {
            Js::PropertyIdArray *propIds = RecyclerNewPlus(scriptContext->GetRecycler(), UInt32Math::Mul(count, sizeof(Js::PropertyId)), Js::PropertyIdArray, count, 0);

            GetFormalArgsArray(this, funcInfo, propIds);
            byteCodeFunction->SetPropertyIdsOfFormals(propIds);
        }
    }

    // Class constructors do not have a [[call]] slot but we don't implement a generic way to express this.
    // What we do is emit a check for the new flag here. If we don't have CallFlags_New set, the opcode will throw.
    // We need to do this before emitting 'this' since the base class constructor will try to construct a new object.
    if (funcInfo->IsClassConstructor())
    {
        m_writer.Empty(Js::OpCode::ChkNewCallFlag);
    }

    // new.target may be used to construct the 'this' register so make sure to load it first
    if (funcInfo->GetNewTargetSymbol())
    {
        this->LoadNewTargetObject(funcInfo);
    }

    if (funcInfo->GetThisSymbol())
    {
        this->LoadThisObject(funcInfo, thisLoadedFromParams);
    }
    else if (ShouldLoadConstThis(funcInfo))
    {
        this->EmitThis(funcInfo, funcInfo->thisConstantRegister, funcInfo->nullConstantRegister);
    }

    if (funcInfo->GetSuperSymbol())
    {
        this->LoadSuperObject(funcInfo);
    }

    if (funcInfo->GetSuperConstructorSymbol())
    {
        this->LoadSuperConstructorObject(funcInfo);
    }

    if (funcInfo->GetImportMetaSymbol())
    {
        this->LoadImportMetaObject(funcInfo);
    }

    //
    // If the function is a function expression with a name,
    // load the function object at runtime to its activation object.
    //
    sym = funcInfo->root->GetFuncSymbol();
    bool funcExprWithName = !funcInfo->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (funcExprWithName)
    {
        if (funcInfo->GetFuncExprNameReference() ||
            (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject()))
        {
            //
            // x = function f(...) { ... }
            // A named function expression's name (Symbol:f) belongs to the enclosing scope.
            // Thus there are no uses of 'f' within the scope of the function (as references to 'f'
            // are looked up in the closure). So, we can't use f's register as it is from the enclosing
            // scope's register namespace. So use a tmp register.
            // In ES5 mode though 'f' is *not* a part of the enclosing scope. So we always assign 'f' a register
            // from it's register namespace, which LdFuncExpr can use.
            //
            Js::RegSlot ldFuncExprDst = sym->GetLocation();
            this->m_writer.Reg1(Js::OpCode::LdFuncExpr, ldFuncExprDst);

            if (sym->IsInSlot(this, funcInfo))
            {
                Js::RegSlot scopeLocation;
                AnalysisAssert(funcInfo->funcExprScope);

                if (funcInfo->funcExprScope->GetIsObject())
                {
                    scopeLocation = funcInfo->funcExprScope->GetLocation();
                    this->m_writer.Property(Js::OpCode::StFuncExpr, sym->GetLocation(), scopeLocation,
                        funcInfo->FindOrAddReferencedPropertyId(sym->GetPosition()));
                }
                else if (funcInfo->paramScope->GetIsObject() || (funcInfo->paramScope->GetCanMerge() && funcInfo->bodyScope->GetIsObject()))
                {
                    this->m_writer.ElementU(Js::OpCode::StLocalFuncExpr, sym->GetLocation(),
                        funcInfo->FindOrAddReferencedPropertyId(sym->GetPosition()));
                }
                else
                {
                    Assert(sym->HasScopeSlot());
                    this->m_writer.SlotI1(Js::OpCode::StLocalSlot, sym->GetLocation(),
                                          sym->GetScopeSlot() + Js::ScopeSlots::FirstSlotIndex);
                }
            }
            else if (ShouldTrackDebuggerMetadata())
            {
                funcInfo->byteCodeFunction->GetFunctionBody()->InsertSymbolToRegSlotList(sym->GetName(), sym->GetLocation(), funcInfo->varRegsCount);
            }
        }
    }
}